

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pce.c
# Opt level: O0

void pce_incspr(int *ip)

{
  int iVar1;
  int size;
  int sy;
  int sx;
  int h;
  int w;
  int y;
  int x;
  int j;
  int i;
  int *ip_local;
  
  _j = ip;
  labldef(loccnt,1);
  if (pass == 1) {
    loadlc(loccnt,0);
  }
  iVar1 = pcx_get_args(_j);
  if ((iVar1 != 0) && (iVar1 = pcx_parse_args(0,pcx_nb_args,&w,&h,&sx,&sy,0x10), iVar1 != 0)) {
    for (x = 0; x < sy; x = x + 1) {
      for (y = 0; y < sx; y = y + 1) {
        iVar1 = pcx_pack_16x16_sprite(buffer,w + y * 0x10,h + x * 0x10);
        putbuffer(buffer,iVar1);
      }
    }
    if (pass == 1) {
      println();
    }
  }
  return;
}

Assistant:

void
pce_incspr(int *ip)
{
	int i, j;
	int x, y, w, h;
	int sx, sy;
	int size;

	/* define label */
	labldef(loccnt, 1);

	/* output */
	if (pass == LAST_PASS)
		loadlc(loccnt, 0);

	/* get args */
	if (!pcx_get_args(ip))
		return;
	if (!pcx_parse_args(0, pcx_nb_args, &x, &y, &w, &h, 16))
		return;

	/* pack sprites */
	for (i = 0; i < h; i++) {
		for (j = 0; j < w; j++) {
			/* sprite coordinates */
			sx = x + (j << 4);
			sy = y + (i << 4);

			/* encode sprite */
			size = pcx_pack_16x16_sprite(buffer, sx, sy);

			/* store sprite */
			putbuffer(buffer, size);
		}
	}

	/* output */
	if (pass == LAST_PASS)
		println();
}